

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

float pbrt::Clamp<float,float,float>(float val,float low,float high)

{
  float high_local;
  float low_local;
  float val_local;
  float local_4;
  
  local_4 = low;
  if ((low <= val) && (local_4 = val, high < val)) {
    local_4 = high;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline constexpr T Clamp(T val, U low, V high) {
    if (val < low)
        return low;
    else if (val > high)
        return high;
    else
        return val;
}